

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

String * __thiscall Json::Value::asString_abi_cxx11_(String *__return_storage_ptr__,Value *this)

{
  bool isPrefixed;
  ValueType VVar1;
  char *__s;
  LargestUInt value;
  String local_1e0;
  ostringstream local_1c0 [8];
  OStringStream oss;
  allocator<char> local_42;
  allocator local_41;
  char *local_40;
  char *this_str;
  allocator<char> local_2d;
  uint this_len;
  allocator<char> local_19;
  Value *local_18;
  Value *this_local;
  
  local_18 = this;
  this_local = (Value *)__return_storage_ptr__;
  VVar1 = type(this);
  switch(VVar1) {
  case nullValue:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator(&local_19);
    break;
  case intValue:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,value);
    break;
  case uintValue:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,value);
    break;
  case realValue:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)0x11,(this->value_).real_,0,0xcb7930);
    break;
  case stringValue:
    if ((this->value_).int_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_2d);
      std::allocator<char>::~allocator(&local_2d);
    }
    else {
      isPrefixed = isAllocated(this);
      decodePrefixedString
                (isPrefixed,(this->value_).string_,(uint *)((long)&this_str + 4),&local_40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,local_40,(ulong)this_str._4_4_,&local_41);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    break;
  case booleanValue:
    __s = "false";
    if (((this->value_).bool_ & 1U) != 0) {
      __s = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_42);
    std::allocator<char>::~allocator(&local_42);
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    std::operator<<((ostream *)local_1c0,"Type is not convertible to string");
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_1e0);
  }
  return __return_storage_ptr__;
}

Assistant:

String Value::asString() const {
  switch (type()) {
  case nullValue:
    return "";
  case stringValue: {
    if (value_.string_ == nullptr)
      return "";
    unsigned this_len;
    char const* this_str;
    decodePrefixedString(this->isAllocated(), this->value_.string_, &this_len,
                         &this_str);
    return String(this_str, this_len);
  }
  case booleanValue:
    return value_.bool_ ? "true" : "false";
  case intValue:
    return valueToString(value_.int_);
  case uintValue:
    return valueToString(value_.uint_);
  case realValue:
    return valueToString(value_.real_);
  default:
    JSON_FAIL_MESSAGE("Type is not convertible to string");
  }
}